

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

void __thiscall
fmcalc::parse_policytc(fmcalc *this,vector<fm_policyTC,_std::allocator<fm_policyTC>_> *p)

{
  pointer *ppfVar1;
  iterator iVar2;
  pointer pfVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  FILE *__stream;
  size_t sVar7;
  iterator iVar8;
  ulong uVar9;
  undefined8 extraout_RAX;
  pointer pvVar10;
  int iVar11;
  int iVar12;
  pointer pfVar13;
  bool bVar14;
  layer_agg l;
  layer_agg l_1;
  string file;
  fm_policyTC f;
  set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> la;
  int local_d0;
  int local_cc;
  fm_policyTC local_c0;
  key_type local_b0;
  fmcalc *local_a8;
  undefined1 local_a0 [36];
  int iStack_7c;
  undefined8 uStack_78;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  _Base_ptr p_Stack_48;
  _Base_ptr local_40;
  size_t local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"input/fm_policytc.bin","");
  local_a8 = this;
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)(local_a0 + 0x20),(ulong)local_a0);
    plVar6 = (long *)std::__cxx11::string::replace
                               ((ulong)(local_a0 + 0x20),0,(char *)0x0,
                                (ulong)(local_a8->inputpath_)._M_dataplus._M_p);
    pvVar10 = (pointer)(plVar6 + 2);
    if ((pointer)*plVar6 == pvVar10) {
      local_58._8_8_ =
           (pvVar10->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      p_Stack_48 = (_Base_ptr)plVar6[3];
      local_60 = (undefined1  [8])(local_58 + 8);
    }
    else {
      local_58._8_8_ =
           (pvVar10->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_60 = (undefined1  [8])*plVar6;
    }
    local_58._0_8_ = plVar6[1];
    *plVar6 = (long)pvVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_a0,(string *)local_60);
    if (local_60 != (undefined1  [8])(local_58 + 8)) {
      operator_delete((void *)local_60);
    }
    if ((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_) != local_70) {
      operator_delete((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_));
    }
  }
  __stream = fopen((char *)local_a0._0_8_,"rb");
  if (__stream == (FILE *)0x0) {
    parse_policytc((fmcalc *)local_a0);
    if ((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_) != local_70) {
      operator_delete((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_));
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    _Unwind_Resume(extraout_RAX);
  }
  sVar7 = fread(local_a0 + 0x20,0x10,1,__stream);
  local_cc = 0;
  if (sVar7 != 0) {
    local_cc = 0;
    do {
      iVar2._M_current =
           (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<fm_policyTC,std::allocator<fm_policyTC>>::_M_realloc_insert<fm_policyTC_const&>
                  ((vector<fm_policyTC,std::allocator<fm_policyTC>> *)p,iVar2,
                   (fm_policyTC *)(local_a0 + 0x20));
      }
      else {
        (iVar2._M_current)->level_id = local_a0._32_4_;
        (iVar2._M_current)->agg_id = iStack_7c;
        *(undefined8 *)&(iVar2._M_current)->layer_id = uStack_78;
        ppfVar1 = &(p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      if (local_cc < (int)local_a0._32_4_) {
        local_cc = local_a0._32_4_;
      }
      sVar7 = fread((fm_policyTC *)(local_a0 + 0x20),0x10,1,__stream);
    } while (sVar7 != 0);
  }
  fclose(__stream);
  p_Stack_48 = (_Base_ptr)local_58;
  local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
  local_58._8_8_ = (_Base_ptr)0x0;
  iVar5 = 0;
  local_38 = 0;
  pfVar13 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d0 = 0;
  local_40 = p_Stack_48;
  if (pfVar13 !=
      (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = 0;
    iVar5 = 0;
    do {
      if (pfVar13->level_id == local_cc) {
        iVar12 = pfVar13->agg_id;
        iVar11 = pfVar13->layer_id;
        local_c0.agg_id = pfVar13->agg_id;
        local_c0.level_id = iVar11;
        std::
        _Rb_tree<layer_agg,layer_agg,std::_Identity<layer_agg>,std::less<layer_agg>,std::allocator<layer_agg>>
        ::_M_insert_unique<layer_agg_const&>
                  ((_Rb_tree<layer_agg,layer_agg,std::_Identity<layer_agg>,std::less<layer_agg>,std::allocator<layer_agg>>
                    *)local_60,(layer_agg *)&local_c0);
        if (local_d0 < iVar11) {
          local_d0 = iVar11;
        }
        if (iVar5 < iVar12) {
          iVar5 = iVar12;
        }
      }
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 !=
             (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < local_d0) {
    iVar12 = 1;
    do {
      if (0 < iVar5) {
        iVar11 = 1;
        do {
          local_b0.layer_id = iVar12;
          local_b0.agg_id = iVar11;
          iVar8 = std::
                  _Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
                  ::find((_Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
                          *)local_60,&local_b0);
          if (iVar8._M_node == (_Base_ptr)local_58) {
            local_c0.agg_id = local_b0.agg_id;
            local_c0.layer_id = local_b0.layer_id;
            local_c0.level_id = local_cc;
            local_c0.profile_id = local_a8->noop_profile_id;
            iVar2._M_current =
                 (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<fm_policyTC,std::allocator<fm_policyTC>>::
              _M_realloc_insert<fm_policyTC_const&>
                        ((vector<fm_policyTC,std::allocator<fm_policyTC>> *)p,iVar2,&local_c0);
            }
            else {
              (iVar2._M_current)->level_id = local_cc;
              (iVar2._M_current)->agg_id = local_b0.agg_id;
              (iVar2._M_current)->layer_id = local_b0.layer_id;
              (iVar2._M_current)->profile_id = local_c0.profile_id;
              ppfVar1 = &(p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppfVar1 = *ppfVar1 + 1;
            }
          }
          bVar14 = iVar11 != iVar5;
          iVar11 = iVar11 + 1;
        } while (bVar14);
      }
      bVar14 = iVar12 != local_d0;
      iVar12 = iVar12 + 1;
    } while (bVar14);
  }
  pfVar13 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar3 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar13 != pfVar3) {
    uVar9 = (long)pfVar3 - (long)pfVar13 >> 4;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<fm_policyTC*,std::vector<fm_policyTC,std::allocator<fm_policyTC>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar13,pfVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<fm_policyTC*,std::vector<fm_policyTC,std::allocator<fm_policyTC>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar13,pfVar3);
  }
  std::
  _Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
  ::~_Rb_tree((_Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
               *)local_60);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  return;
}

Assistant:

void fmcalc::parse_policytc(std::vector< fm_policyTC> &p)
{
	FILE* fin = NULL;
	std::string file = FMPOLICYTC_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");

	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_policyTC f;
	
	int max_layer_id = 0;
	int max_level_id = 0;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		p.push_back(f);		
		if (f.level_id > max_level_id) max_level_id = f.level_id;			
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);
	std::set<layer_agg> la;
	auto iter = p.begin();
	int max_agg_id = 0;

	while (iter != p.end()) {
		if (iter->level_id == max_level_id) {
			if (iter->agg_id > max_agg_id) max_agg_id = iter->agg_id;
			if (iter->layer_id > max_layer_id) max_layer_id = iter->layer_id;
			layer_agg l;
			l.agg_id = iter->agg_id;
			l.layer_id = iter->layer_id;
			la.insert(l);
		}
		iter++;
	}


	for (int i = 1;i <= max_layer_id;i++) {
		for (int j = 1;j <= max_agg_id;j++) {
			layer_agg l;
			l.layer_id = i;
			l.agg_id = j;
			auto iter = la.find(l);
			if (iter == la.end()) {
				fm_policyTC f;
				f.agg_id = l.agg_id;
				f.layer_id = l.layer_id;
				f.level_id = max_level_id;
				f.profile_id = noop_profile_id;
				p.push_back(f);
			}
		}
	}


	std::sort(p.begin(), p.end());

}